

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

CustomModel_CustomModelParamValue *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomModel_CustomModelParamValue>(Arena *arena)

{
  CustomModel_CustomModelParamValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomModel_CustomModelParamValue *)operator_new(0x20);
    CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
              (this,(Arena *)0x0,false);
  }
  else {
    this = (CustomModel_CustomModelParamValue *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)
                      &CoreML::Specification::CustomModel_CustomModelParamValue::typeinfo);
    CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }